

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::SupportVectorClassifier::Clear(SupportVectorClassifier *this)

{
  ulong uVar1;
  Kernel *this_00;
  undefined8 *puVar2;
  
  (this->numberofsupportvectorsperclass_).current_size_ = 0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
            (&(this->coefficients_).super_RepeatedPtrFieldBase);
  (this->rho_).current_size_ = 0;
  (this->proba_).current_size_ = 0;
  (this->probb_).current_size_ = 0;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) && (this_00 = this->kernel_, this_00 != (Kernel *)0x0)) {
    Kernel::~Kernel(this_00);
    operator_delete(this_00,0x20);
  }
  this->kernel_ = (Kernel *)0x0;
  clear_supportVectors(this);
  clear_ClassLabels(this);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void SupportVectorClassifier::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.SupportVectorClassifier)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  numberofsupportvectorsperclass_.Clear();
  coefficients_.Clear();
  rho_.Clear();
  proba_.Clear();
  probb_.Clear();
  if (GetArenaForAllocation() == nullptr && kernel_ != nullptr) {
    delete kernel_;
  }
  kernel_ = nullptr;
  clear_supportVectors();
  clear_ClassLabels();
  _internal_metadata_.Clear<std::string>();
}